

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paper_example_put_array.c
# Opt level: O3

void paper_example_put_array(void)

{
  bsp_pid_t bVar1;
  bsp_pid_t bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 uVar8;
  int xs [3];
  uint local_24;
  uint local_20;
  uint local_1c;
  
  bVar1 = bsp_nprocs();
  bsp_begin(bVar1);
  bVar1 = bsp_nprocs();
  bVar2 = bsp_pid();
  iVar3 = bVar1 - bVar2;
  local_24 = iVar3 * 3 - 1;
  local_20 = iVar3 * 3 - 2;
  local_1c = iVar3 * 3 - 3;
  put_array((int *)&local_24,bVar1 * 3);
  uVar7 = (ulong)local_24;
  uVar4 = (ulong)(uint)(bVar2 * 3);
  if (local_24 == bVar2 * 3) {
    uVar4 = (ulong)(local_24 + 1);
    if (local_20 == local_24 + 1) {
      if (local_1c == local_24 + 2) {
        bsp_end();
        return;
      }
      pcVar6 = "xs[2]";
      pcVar5 = "s*3 + 2";
      uVar4 = (ulong)(local_24 + 2);
      uVar7 = (ulong)local_1c;
      uVar8 = 0x28;
    }
    else {
      pcVar6 = "xs[1]";
      pcVar5 = "s*3 + 1";
      uVar7 = (ulong)local_20;
      uVar8 = 0x27;
    }
  }
  else {
    pcVar6 = "xs[0]";
    pcVar5 = "s*3";
    uVar8 = 0x26;
  }
  printf("TEST FAILED: Expected %s to be equal to %s = %d but got %d\n   /workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/test/paper_example_put_array.c:%d\n"
         ,pcVar6,pcVar5,uVar4,uVar7,uVar8);
  abort();
}

Assistant:

void put_array( int * xs, int n ) {
    int i, dst_pid, dst_idx;
    int p = bsp_nprocs();
    int n_over_p = n/p;

    if ((n%p) != 0)
        bsp_abort("{put_array} n=%d not divisible by p=%d\n", n, p);
    bsp_push_reg( xs, n_over_p*sizeof(xs[0]));
    bsp_sync();

    for (i = 0; i < n_over_p; ++i) {
        dst_pid = xs[i] / n_over_p;
        dst_idx = xs[i] % n_over_p;
        bsp_put( dst_pid, &xs[i], xs, dst_idx*sizeof(xs[0]), sizeof(xs[0]));
    }
    bsp_sync();
    bsp_pop_reg(xs);
}